

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

string * __thiscall
lest::to_string<int,int>(string *__return_storage_ptr__,lest *this,int *lhs,string *op,int *rhs)

{
  ostream *poVar1;
  ostringstream os;
  int local_1dc;
  string local_1d8;
  string local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  local_1d8._M_dataplus._M_p._0_4_ = *(undefined4 *)this;
  make_value_string<int>(&local_1b8,(int *)&local_1d8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,*(char **)lhs,*(long *)(lhs + 2));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  local_1dc = *(int *)&(op->_M_dataplus)._M_p;
  make_value_string<int>(&local_1d8,&local_1dc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(char *)CONCAT44(local_1d8._M_dataplus._M_p._4_4_,
                                     local_1d8._M_dataplus._M_p._0_4_),local_1d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_1d8._M_dataplus._M_p._4_4_,local_1d8._M_dataplus._M_p._0_4_) !=
      &local_1d8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_1d8._M_dataplus._M_p._4_4_,local_1d8._M_dataplus._M_p._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

auto to_string( L const & lhs, std::string op, R const & rhs ) -> std::string
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}